

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::setMinimizeMode(QMdiSubWindowPrivate *this)

{
  QMdiSubWindow *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  
  this_00 = *(QMdiSubWindow **)&(this->super_QWidgetPrivate).field_0x8;
  ensureWindowState(this,WindowMinimized);
  this->isShadeRequestFromMinimizeMode = true;
  QMdiSubWindow::showShaded(this_00);
  this->isShadeRequestFromMinimizeMode = false;
  this->moveEnabled = false;
  pDVar1 = this->actions[1].wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (pQVar2 = this->actions[1].wp.value, pQVar2 != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(pQVar2,0));
  }
  setActive(this,true,true);
  return;
}

Assistant:

void QMdiSubWindowPrivate::setMinimizeMode()
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(parent);

    ensureWindowState(Qt::WindowMinimized);
    isShadeRequestFromMinimizeMode = true;
    q->showShaded();
    isShadeRequestFromMinimizeMode = false;

    moveEnabled = false;
#ifndef QT_NO_ACTION
    setEnabled(MoveAction, moveEnabled);
#endif

    Q_ASSERT(q->windowState() & Qt::WindowMinimized);
    Q_ASSERT(!(q->windowState() & Qt::WindowMaximized));
    // This should be a valid assert, but people can actually re-implement
    // setVisible and do crazy stuff, so we're not guaranteed that
    // the widget is hidden after calling hide().
    // Q_ASSERT(baseWidget ? baseWidget->isHidden() : true);

    setActive(true);
}